

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_struct_as_typed_root_with_size
              (void *buf,size_t bufsiz,flatbuffers_thash_t thash,size_t size,uint16_t align)

{
  int iVar1;
  size_t bufsiz_local;
  
  bufsiz_local = bufsiz;
  iVar1 = flatcc_verify_typed_buffer_header_with_size(buf,&bufsiz_local,thash);
  if (iVar1 != 0) {
    iVar1 = flatcc_verify_typed_buffer_header_with_size(buf,&bufsiz_local,thash);
    return iVar1;
  }
  iVar1 = verify_struct((flatbuffers_uoffset_t)bufsiz_local,4,
                        *(flatbuffers_uoffset_t *)((long)buf + 4),(flatbuffers_uoffset_t)size,align)
  ;
  return iVar1;
}

Assistant:

int flatcc_verify_struct_as_typed_root_with_size(const void *buf, size_t bufsiz, flatbuffers_thash_t thash, size_t size, uint16_t align)
{
    check_result(flatcc_verify_typed_buffer_header_with_size(buf, &bufsiz, thash));
    return verify_struct((uoffset_t)bufsiz, uoffset_size, read_uoffset(buf, uoffset_size), (uoffset_t)size, align);
}